

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_8bad::Options::Options(Options *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 0xb;
  *(undefined4 *)(in_RDI + 8) = 10;
  in_RDI[0xc] = 0;
  *(undefined4 *)(in_RDI + 0x10) = 8;
  in_RDI[0x14] = 0;
  *(undefined4 *)(in_RDI + 0x18) = 8;
  in_RDI[0x1c] = 0;
  *(undefined4 *)(in_RDI + 0x20) = 7;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  return;
}

Assistant:

Options::Options()
    : is_point_cloud(false),
      pos_quantization_bits(11),
      tex_coords_quantization_bits(10),
      tex_coords_deleted(false),
      normals_quantization_bits(8),
      normals_deleted(false),
      generic_quantization_bits(8),
      generic_deleted(false),
      compression_level(7),
      preserve_polygons(false),
      use_metadata(false) {}